

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O3

void createVars(vec<BoolView> *x,int n)

{
  BoolView *pBVar1;
  int iVar2;
  long lVar3;
  
  vec<BoolView>::growTo(x,n);
  if (0 < n) {
    lVar3 = 0;
    do {
      iVar2 = SAT::newVar(&sat,1,(ChannelInfo)0x0);
      pBVar1 = x->data;
      *(int *)((long)&pBVar1->v + lVar3) = iVar2;
      (&pBVar1->s)[lVar3] = false;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar3);
  }
  return;
}

Assistant:

void createVars(vec<BoolView>& x, int n) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i] = newBoolVar();
	}
}